

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *pOVar4;
  OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *layout;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1215,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = Js::ByteCodeReader::
           GetLayout<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
                     (&this->m_jnReader);
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,ClosureRegCheckPhase,sourceContextId,functionId);
  if (!bVar2) {
    DoClosureRegCheck(this,(uint)pOVar4->Value);
    DoClosureRegCheck(this,(uint)pOVar4->Instance);
  }
  BuildElementCP(this,newOpcode,offset,(uint)pOVar4->Instance,(uint)pOVar4->Value,
                 (uint)pOVar4->inlineCacheIndex);
  return;
}

Assistant:

void
IRBuilder::BuildElementCP(Js::OpCode newOpcode, uint32 offset)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));
    auto layout = m_jnReader.GetLayout<Js::OpLayoutT_ElementCP<SizePolicy>>();

    if (!PHASE_OFF(Js::ClosureRegCheckPhase, m_func))
    {
        this->DoClosureRegCheck(layout->Value);
        this->DoClosureRegCheck(layout->Instance);
    }

    BuildElementCP(newOpcode, offset, layout->Instance, layout->Value, layout->inlineCacheIndex);
}